

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall basisu::vector<int>::erase(vector<int> *this,int *pFirst,int *pEnd)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (pEnd < pFirst) {
    __assert_fail("pFirst <= pEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x318,"void basisu::vector<int>::erase(T *, T *) [T = int]");
  }
  piVar1 = this->m_p;
  if ((pFirst < piVar1) || (piVar1 + this->m_size < pFirst)) {
    __assert_fail("pFirst >= begin() && pFirst <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x319,"void basisu::vector<int>::erase(T *, T *) [T = int]");
  }
  if (piVar1 + this->m_size < pEnd) {
    __assert_fail("pEnd >= begin() && pEnd <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x31a,"void basisu::vector<int>::erase(T *, T *) [T = int]");
  }
  uVar2 = (long)pFirst - (long)piVar1 >> 2;
  if (uVar2 >> 0x20 == 0) {
    uVar3 = (long)pEnd - (long)pFirst >> 2;
    if (uVar3 >> 0x20 == 0) {
      erase(this,(uint32_t)uVar2,(uint32_t)uVar3);
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x326,"void basisu::vector<int>::erase(T *, T *) [T = int]");
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                ,799,"void basisu::vector<int>::erase(T *, T *) [T = int]");
}

Assistant:

inline void erase(T *pFirst, T *pEnd)
      {
         assert(pFirst <= pEnd);
         assert(pFirst >= begin() && pFirst <= end());
         assert(pEnd >= begin() && pEnd <= end());

         int64_t ofs = pFirst - begin();
         if ((ofs < 0) || (ofs > UINT32_MAX))
         {
            assert(0);
            return;
         }

         int64_t n = pEnd - pFirst;
         if ((n < 0) || (n > UINT32_MAX))
         {
            assert(0);
            return;
         }

         erase((uint32_t)ofs, (uint32_t)n);
      }